

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O0

void __thiscall Buffer::Buffer(Buffer *this,string *content)

{
  Members *this_00;
  size_t size;
  uchar *buf;
  string *content_local;
  Buffer *this_local;
  
  this_00 = (Members *)operator_new(0x38);
  size = std::__cxx11::string::size();
  buf = (uchar *)std::__cxx11::string::data();
  Members::Members(this_00,size,buf,false);
  std::unique_ptr<Buffer::Members,std::default_delete<Buffer::Members>>::
  unique_ptr<std::default_delete<Buffer::Members>,void>
            ((unique_ptr<Buffer::Members,std::default_delete<Buffer::Members>> *)this,this_00);
  return;
}

Assistant:

Buffer::Buffer(std::string& content) :
    m(new Members(content.size(), reinterpret_cast<unsigned char*>(content.data()), false))
{
}